

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

ProgressInfo __thiscall Quest_Context::Progress(Quest_Context *this)

{
  string *__lhs;
  iterator *piVar1;
  Character *this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Rule *pRVar6;
  reference pvVar7;
  size_type sVar8;
  const_iterator cVar9;
  ulong uVar10;
  undefined8 uVar11;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string goal_progress_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  goal_progress_key._M_dataplus._M_p = (pointer)&goal_progress_key.field_2;
  goal_progress_key._M_string_length = 0;
  goal_progress_key.field_2._M_local_buf[0] = '\0';
  pRVar6 = EOPlus::Context::GetGoal(&this->super_Context);
  uVar11 = 5;
  if (pRVar6 == (Rule *)0x0) {
LAB_0016d97c:
    uVar10 = 0;
LAB_0016d97e:
    uVar3 = 0;
  }
  else {
    __lhs = &(pRVar6->expr).function;
    bVar2 = std::operator==(__lhs,"gotitems");
    if (!bVar2) {
      bVar2 = std::operator==(__lhs,"gotspell");
      if (!bVar2) {
        bVar2 = std::operator==(__lhs,"useditem");
        if (!bVar2) {
          bVar2 = std::operator==(__lhs,"usedspell");
          if (!bVar2) {
            bVar2 = std::operator==(__lhs,"killednpcs");
            if (bVar2) {
              std::operator+(&local_90,__lhs,"/");
              piVar1 = &(pRVar6->expr).args.
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start;
              pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                       operator[](piVar1,0);
              util::variant::GetString_abi_cxx11_(&local_b0,pvVar7);
              std::operator+(&local_50,&local_90,&local_b0);
              std::__cxx11::string::operator=((string *)&goal_progress_key,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_90);
              sVar8 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                (&(pRVar6->expr).args);
              if (1 < sVar8) {
                pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                         operator[](piVar1,1);
                uVar3 = util::variant::GetInt(pvVar7);
                goto LAB_0016d924;
              }
              uVar10 = 1;
            }
            else {
              bVar2 = std::operator==(__lhs,"killedplayers");
              if (!bVar2) {
                bVar2 = std::operator==(__lhs,"entercoord");
                if (!bVar2) {
                  bVar2 = std::operator==(__lhs,"leavecoord");
                  if (!bVar2) {
                    bVar2 = std::operator==(__lhs,"entermap");
                    if (!bVar2) {
                      bVar2 = std::operator==(__lhs,"leavemap");
                      if (!bVar2) goto LAB_0016d97c;
                    }
                  }
                }
                uVar11 = 10;
                goto LAB_0016d97c;
              }
              std::__cxx11::string::_M_assign((string *)&goal_progress_key);
              pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                       operator[](&(pRVar6->expr).args.
                                   super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                   _M_impl.super__Deque_impl_data._M_start,0);
              uVar3 = util::variant::GetInt(pvVar7);
LAB_0016d924:
              uVar10 = (ulong)uVar3;
            }
            uVar11 = 8;
            goto LAB_0016d97e;
          }
        }
        std::operator+(&local_90,__lhs,"/");
        piVar1 = &(pRVar6->expr).args.
                  super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                  super__Deque_impl_data._M_start;
        pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                           (piVar1,0);
        util::variant::GetString_abi_cxx11_(&local_b0,pvVar7);
        std::operator+(&local_50,&local_90,&local_b0);
        std::__cxx11::string::operator=((string *)&goal_progress_key,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        sVar8 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                          (&(pRVar6->expr).args);
        if (sVar8 < 2) {
          uVar10 = 1;
        }
        else {
          pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                             (piVar1,1);
          uVar3 = util::variant::GetInt(pvVar7);
          uVar10 = (ulong)uVar3;
        }
        uVar11 = 3;
        goto LAB_0016d97e;
      }
    }
    piVar1 = &(pRVar6->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
              _M_impl.super__Deque_impl_data._M_start;
    pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                       (piVar1,1);
    uVar3 = util::variant::GetInt(pvVar7);
    this_00 = this->character;
    pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                       (piVar1,0);
    iVar4 = util::variant::GetInt(pvVar7);
    uVar5 = Character::HasItem(this_00,(short)iVar4,false);
    if ((int)uVar5 < (int)uVar3) {
      uVar3 = uVar5;
    }
    sVar8 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&(pRVar6->expr).args);
    if (sVar8 < 2) {
      uVar10 = 1;
    }
    else {
      pvVar7 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                         (piVar1,1);
      uVar5 = util::variant::GetInt(pvVar7);
      uVar10 = (ulong)uVar5;
    }
    uVar11 = 3;
  }
  if (goal_progress_key._M_string_length != 0) {
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
            ::find(&(this->progress)._M_t,&goal_progress_key);
    if ((_Rb_tree_header *)cVar9._M_node != &(this->progress)._M_t._M_impl.super__Rb_tree_header) {
      uVar3 = (uint)(ushort)(short)cVar9._M_node[2]._M_color;
    }
  }
  std::__cxx11::string::~string((string *)&goal_progress_key);
  return (ProgressInfo)((uint6)uVar11 | (uint6)(uVar3 << 0x10) | (uint6)((uVar10 & 0xffff) << 0x20))
  ;
}

Assistant:

Quest_Context::ProgressInfo Quest_Context::Progress() const
{
	BookIcon icon = BOOK_ICON_TALK;
	std::string goal_progress_key;
	short goal_progress = 0;
	short goal_goal = 0;

	const EOPlus::Rule* goal = this->GetGoal();

	if (goal)
	{
		if (goal->expr.function == "gotitems" || goal->expr.function == "gotspell")
		{
			icon = BOOK_ICON_ITEM;
			goal_progress = std::min<int>(goal->expr.args[1], this->character->HasItem(int(goal->expr.args[0])));
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "useditem" || goal->expr.function == "usedspell")
		{
			icon = BOOK_ICON_ITEM;
			goal_progress_key = goal->expr.function + "/" + std::string(goal->expr.args[0]);
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "killednpcs")
		{
			icon = BOOK_ICON_KILL;
			goal_progress_key = goal->expr.function + "/" + std::string(goal->expr.args[0]);
			goal_goal = goal->expr.args.size() >= 2 ? int(goal->expr.args[1]) : 1;
		}
		else if (goal->expr.function == "killedplayers")
		{
			icon = BOOK_ICON_KILL;
			goal_progress_key = goal->expr.function;
			goal_goal = int(goal->expr.args[0]);
		}
		else if (goal->expr.function == "entercoord" || goal->expr.function == "leavecoord" || goal->expr.function == "entermap" || goal->expr.function == "leavemap")
		{
			icon = BOOK_ICON_STEP;
		}
	}

	if (!goal_progress_key.empty())
	{
		auto it = this->progress.find(goal_progress_key);

		if (it != this->progress.end())
			goal_progress = it->second;
	}

	return ProgressInfo{icon, goal_progress, goal_goal};
}